

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  WirePointer *pWVar1;
  byte bVar2;
  StructReader value;
  ListReader value_00;
  ListReader value_01;
  ClientHook *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  WirePointer *pWVar5;
  SegmentBuilder *extraout_RAX;
  SegmentBuilder *extraout_RAX_00;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  SegmentReader *pSVar10;
  word *extraout_RDX;
  word *extraout_RDX_00;
  WirePointer *pWVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  SegmentReader **ppSVar16;
  ulong uVar17;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *pDVar18;
  bool bVar19;
  SegmentAnd<capnp::word_*> SVar20;
  SegmentReader *srcSegment_local;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  ClientHook *local_d0;
  Fault f_2;
  undefined1 uStack_99;
  undefined4 uStack_94;
  undefined1 uStack_69;
  undefined4 uStack_64;
  undefined2 uStack_3a;
  undefined4 uStack_34;
  SegmentBuilder *pSVar6;
  word *pwVar11;
  
  uVar7 = (src->offsetAndKind).value;
  srcSegment_local = srcSegment;
  if ((src->field_1).upper32Bits != 0 || uVar7 != 0) {
    pWVar12 = src;
    if ((uVar7 & 3) == 2 && srcSegment != (SegmentReader *)0x0) {
      iVar4 = (*srcSegment->arena->_vptr_Arena[2])();
      srcSegment_local = (SegmentReader *)CONCAT44(extraout_var,iVar4);
      _kjCondition.left = &srcSegment_local;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = srcSegment_local != (SegmentReader *)0x0;
      if (srcSegment_local == (SegmentReader *)0x0) {
        pDVar18 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)pDVar18,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
      }
      else {
        uVar7 = (src->offsetAndKind).value;
        uVar17 = (ulong)(uVar7 >> 3);
        uVar14 = (srcSegment_local->ptr).size_;
        if ((long)uVar14 < (long)uVar17) {
          uVar17 = uVar14;
        }
        uVar8 = 2 - (ulong)((uVar7 & 4) == 0);
        if (uVar17 + uVar8 <= uVar14) {
          pWVar12 = (WirePointer *)((srcSegment_local->ptr).ptr + uVar17);
          uVar14 = srcSegment_local->readLimiter->limit;
          if (uVar8 <= uVar14) {
            srcSegment_local->readLimiter->limit = uVar14 - uVar8;
            if (((src->offsetAndKind).value & 4) != 0) {
              iVar4 = (*srcSegment_local->arena->_vptr_Arena[2])
                                (srcSegment_local->arena,(ulong)(pWVar12->field_1).upper32Bits);
              newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar4);
              _kjCondition.left = &newSegment;
              _kjCondition.right = (void *)0x0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = newSegment != (SegmentReader *)0x0;
              if (newSegment == (SegmentReader *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,&_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_00124743:
                srcTarget = (word *)0x0;
                kj::_::Debug::Fault::~Fault(&f_2);
              }
              else {
                uVar7 = (pWVar12->offsetAndKind).value & 3;
                _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar7);
                _kjCondition.right = anon_var_dwarf_1caca;
                _kjCondition.op.content.ptr = (char *)0x5;
                _kjCondition.op.content.size_ = (size_t)(uVar7 == 2);
                if (uVar7 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            (&f_2,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_00124743;
                }
                uVar17 = (ulong)((pWVar12->offsetAndKind).value >> 3);
                uVar14 = (newSegment->ptr).size_;
                if ((long)uVar14 < (long)uVar17) {
                  uVar17 = uVar14;
                }
                srcTarget = (newSegment->ptr).ptr + uVar17;
                srcSegment_local = newSegment;
              }
              pWVar12 = pWVar12 + 1;
              goto LAB_0012413a;
            }
            pWVar1 = pWVar12 + 1;
            uVar7 = (pWVar12->offsetAndKind).value;
            lVar15 = (long)((int)uVar7 >> 2);
            pWVar5 = pWVar1 + lVar15;
            if (srcSegment_local == (SegmentReader *)0x0) {
              switch(uVar7 & 3) {
              case 1:
                goto switchD_001242e7_caseD_1;
              case 2:
                goto switchD_001242e7_caseD_2;
              case 3:
                goto switchD_001242e7_caseD_3;
              }
            }
            else {
              pwVar11 = (srcSegment_local->ptr).ptr;
              srcTarget = pwVar11 + (srcSegment_local->ptr).size_;
              if ((lVar15 < (long)pwVar11 - (long)pWVar1 >> 3) ||
                 ((long)srcTarget - (long)pWVar1 >> 3 < lVar15)) goto LAB_0012413a;
              switch(uVar7 & 3) {
              case 1:
                goto switchD_001242e7_caseD_1;
              case 2:
                goto switchD_001242e7_caseD_2;
              case 3:
                goto switchD_001242e7_caseD_3;
              }
            }
            goto switchD_001242e7_caseD_0;
          }
          (*srcSegment_local->arena->_vptr_Arena[3])();
        }
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        pDVar18 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)pDVar18,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
      goto LAB_001245e1;
    }
LAB_0012413a:
    pWVar5 = (WirePointer *)srcTarget;
    if (pWVar5 == (WirePointer *)0x0) goto LAB_001245f0;
    uVar7 = (pWVar12->offsetAndKind).value;
    switch(uVar7 & 3) {
    case 0:
switchD_001242e7_caseD_0:
      _kjCondition.left = (SegmentReader **)&nestingLimit;
      _kjCondition.right = (void *)((ulong)_kjCondition.right & 0xffffffff00000000);
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < nestingLimit;
      if (nestingLimit < 1) {
        iVar4 = 0x7bc;
        goto LAB_001245d7;
      }
      if (srcSegment_local == (SegmentReader *)0x0) {
        pSVar10 = (SegmentReader *)0x0;
LAB_00124789:
        value.pointerCount = (pWVar12->field_1).structRef.ptrCount.value;
        value.dataSize = (uint)*(ushort *)&pWVar12->field_1 << 6;
        value._38_2_ = uStack_3a;
        value._44_4_ = uStack_34;
        value.nestingLimit = nestingLimit + -1;
        value.capTable = srcCapTable;
        value.segment = pSVar10;
        value.data = pWVar5;
        value.pointers = pWVar5 + *(ushort *)&pWVar12->field_1;
        SVar20 = setStructPointer(dstSegment,dstCapTable,dst,value,orphanArena,canonical);
        goto LAB_001249d0;
      }
      uVar14 = (ulong)(pWVar12->field_1).structRef.dataSize.value +
               (ulong)(pWVar12->field_1).structRef.ptrCount.value;
      if (((long)pWVar5 - (long)(srcSegment_local->ptr).ptr >> 3) + uVar14 <=
          (srcSegment_local->ptr).size_) {
        uVar17 = srcSegment_local->readLimiter->limit;
        if (uVar14 <= uVar17) {
          srcSegment_local->readLimiter->limit = uVar17 - uVar14;
          pSVar10 = srcSegment_local;
          goto LAB_00124789;
        }
        (*srcSegment_local->arena->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      pDVar18 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                ((Fault *)pDVar18,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x7c2,FAILED,"boundsCheck(srcSegment, ptr, src->structRef.wordSize())",
                 "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [322])
                 "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
      break;
    case 1:
switchD_001242e7_caseD_1:
      bVar2 = *(byte *)&pWVar12->field_1;
      _kjCondition.left = (SegmentReader **)&nestingLimit;
      _kjCondition.right = (void *)((ulong)_kjCondition.right & 0xffffffff00000000);
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < nestingLimit;
      if (0 < nestingLimit) {
        bVar9 = bVar2 & 7;
        if (bVar9 == 7) {
          f_2.exception._0_4_ = (pWVar12->field_1).upper32Bits >> 3;
          if (srcSegment_local == (SegmentReader *)0x0) {
LAB_0012489b:
            uVar7 = (pWVar5->offsetAndKind).value;
            bVar19 = (uVar7 & 3) == 0;
            _kjCondition.left = (SegmentReader **)((ulong)uVar7 & 0xffffffff00000003);
            _kjCondition.right = anon_var_dwarf_1caca;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)bVar19;
            if (bVar19) {
              uVar7 = (pWVar5->offsetAndKind).value >> 2;
              uVar14 = (ulong)(uVar7 & 0x1fffffff);
              uVar13 = (uint)(pWVar5->field_1).structRef.ptrCount.value +
                       (uint)(pWVar5->field_1).structRef.dataSize.value;
              _kjCondition.left = (SegmentReader **)(uVar13 * uVar14);
              _kjCondition.right = &f_2;
              _kjCondition.op.content.ptr = " <= ";
              ppSVar16 = (SegmentReader **)(ulong)(uint)f_2.exception;
              _kjCondition.op.content.size_ = 5;
              bVar19 = (long)_kjCondition.left - (long)ppSVar16 == 0;
              _kjCondition.result = _kjCondition.left < ppSVar16 || bVar19;
              if (_kjCondition.left < ppSVar16 || bVar19) {
                pSVar10 = srcSegment_local;
                if (uVar13 == 0) {
                  if (srcSegment_local == (SegmentReader *)0x0) {
                    pSVar10 = (SegmentReader *)0x0;
                  }
                  else {
                    uVar17 = srcSegment_local->readLimiter->limit;
                    if (uVar17 < uVar14) {
                      (*srcSegment_local->arena->_vptr_Arena[3])();
                      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
                      kj::_::Debug::Fault::
                      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                                ((Fault *)&_kjCondition,
                                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                                 ,0x7f2,FAILED,
                                 "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))"
                                 ,"_kjCondition,\"Message contains amplified list pointer.\"",
                                 (DebugExpression<bool> *)&newSegment,
                                 (char (*) [41])"Message contains amplified list pointer.");
                      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                      iVar4 = 2;
                      pSVar6 = extraout_RAX_00;
                      pwVar11 = extraout_RDX_00;
                      goto LAB_00124a83;
                    }
                    srcSegment_local->readLimiter->limit = uVar17 - uVar14;
                  }
                }
                uVar14 = CONCAT44(uVar13 * 0x40,uVar7) & 0xffffffff1fffffff;
                value_01.structPointerCount = (pWVar5->field_1).structRef.ptrCount.value;
                value_01.structDataSize = (uint)(pWVar5->field_1).structRef.dataSize.value << 6;
                value_01.elementSize = 7;
                value_01._39_1_ = uStack_69;
                value_01._44_4_ = uStack_64;
                value_01.nestingLimit = nestingLimit + -1;
                value_01.capTable = srcCapTable;
                value_01.segment = pSVar10;
                value_01.ptr = (byte *)(pWVar5 + 1);
                value_01.elementCount = (int)uVar14;
                value_01.step = (int)(uVar14 >> 0x20);
                SVar20 = setListPointer(dstSegment,dstCapTable,dst,value_01,orphanArena,canonical);
                pwVar11 = SVar20.value;
                pSVar6 = SVar20.segment;
                iVar4 = 1;
                goto LAB_00124a83;
              }
              pDVar18 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                        ((Fault *)pDVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7ea,FAILED,
                         "wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount",
                         "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                         ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
            }
            else {
              pDVar18 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                        ((Fault *)pDVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                         "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                         ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                           *)&_kjCondition,
                         (char (*) [61])
                         "INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
            }
          }
          else {
            if (((long)pWVar5 - (long)(srcSegment_local->ptr).ptr >> 3) + (ulong)(uint)f_2.exception
                + 1 <= (srcSegment_local->ptr).size_) {
              uVar14 = (ulong)(uint)f_2.exception + 1;
              uVar17 = srcSegment_local->readLimiter->limit;
              if (uVar14 <= uVar17) {
                srcSegment_local->readLimiter->limit = uVar17 - uVar14;
                goto LAB_0012489b;
              }
              (*srcSegment_local->arena->_vptr_Arena[3])();
            }
            newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
            pDVar18 = &_kjCondition;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                      ((Fault *)pDVar18,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x7db,FAILED,
                       "boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                       "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [319])
                       "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
          }
          kj::_::Debug::Fault::~Fault((Fault *)pDVar18);
          iVar4 = 2;
          pSVar6 = extraout_RAX;
          pwVar11 = extraout_RDX;
          goto LAB_00124a83;
        }
        iVar4 = *(int *)(BITS_PER_ELEMENT_TABLE + ((ulong)bVar2 & 7) * 4);
        uVar7 = (uint)(bVar9 == 6) * 0x40 + iVar4;
        uVar13 = (pWVar12->field_1).upper32Bits >> 3;
        uVar14 = (ulong)uVar13;
        if (srcSegment_local != (SegmentReader *)0x0) {
          uVar17 = uVar7 * uVar14 + 0x3f >> 6 & 0xffffffff;
          if (((long)pWVar5 - (long)(srcSegment_local->ptr).ptr >> 3) + uVar17 <=
              (srcSegment_local->ptr).size_) {
            uVar8 = srcSegment_local->readLimiter->limit;
            if (uVar17 <= uVar8) {
              srcSegment_local->readLimiter->limit = uVar8 - uVar17;
              pSVar10 = srcSegment_local;
              if (bVar9 == 0) {
                if (srcSegment_local == (SegmentReader *)0x0) goto LAB_00124879;
                uVar17 = srcSegment_local->readLimiter->limit;
                if (uVar17 < uVar14) {
                  (*srcSegment_local->arena->_vptr_Arena[3])();
                  newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            ((Fault *)&_kjCondition,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x80f,FAILED,
                             "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))",
                             "_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)&newSegment,
                             (char (*) [41])"Message contains amplified list pointer.");
                  kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                  goto LAB_001245f0;
                }
                srcSegment_local->readLimiter->limit = uVar17 - uVar14;
              }
              goto LAB_00124954;
            }
            (*srcSegment_local->arena->_vptr_Arena[3])();
          }
          newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
          pDVar18 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)pDVar18,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x807,FAILED,"boundsCheck(srcSegment, ptr, wordCount)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          break;
        }
LAB_00124879:
        pSVar10 = (SegmentReader *)0x0;
LAB_00124954:
        value_00.step = uVar7;
        value_00.elementCount = uVar13;
        uVar14 = CONCAT17(uStack_99,CONCAT16(bVar2,(uint6)CONCAT14(bVar9 == 6,iVar4))) &
                 0xff07ffffffffffff;
        value_00._44_4_ = uStack_94;
        value_00.nestingLimit = nestingLimit + -1;
        value_00.capTable = srcCapTable;
        value_00.segment = pSVar10;
        value_00.ptr = (byte *)pWVar5;
        value_00.structDataSize = (int)uVar14;
        value_00.structPointerCount = (short)(uVar14 >> 0x20);
        value_00.elementSize = (char)(uVar14 >> 0x30);
        value_00._39_1_ = (char)(uVar14 >> 0x38);
        SVar20 = setListPointer(dstSegment,dstCapTable,dst,value_00,orphanArena,canonical);
LAB_001249d0:
        pwVar11 = SVar20.value;
        pSVar6 = SVar20.segment;
        goto LAB_00124610;
      }
      iVar4 = 0x7d1;
LAB_001245d7:
      _kjCondition.left = (SegmentReader **)&nestingLimit;
      _kjCondition.op.content.size_ = 4;
      _kjCondition.op.content.ptr = " > ";
      pDVar18 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                ((Fault *)&newSegment,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,iVar4,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,(DebugComparison<int_&,_int> *)&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      break;
    case 2:
switchD_001242e7_caseD_2:
      pDVar18 = &_kjCondition;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)pDVar18,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x81c,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                 (char (*) [24])"Unexpected FAR pointer.");
      break;
    case 3:
switchD_001242e7_caseD_3:
      newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar7 == 3);
      if (uVar7 == 3) {
        if (canonical != false) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x826,FAILED,(char *)0x0,
                     "\"Cannot create a canonical message with a capability\"",
                     (char (*) [52])"Cannot create a canonical message with a capability");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        }
        (**srcCapTable->_vptr_CapTableReader)
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&newSegment,srcCapTable,
                   (ulong)(pWVar12->field_1).upper32Bits);
        pCVar3 = local_d0;
        _kjCondition.left = (SegmentReader **)newSegment;
        _kjCondition.right = local_d0;
        local_d0 = (ClientHook *)0x0;
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&newSegment);
        if (pCVar3 == (ClientHook *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                    ((Fault *)&newSegment,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x831,FAILED,(char *)0x0,"\"Message contained invalid capability pointer.\"",
                     (char (*) [46])"Message contained invalid capability pointer.");
          kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
          iVar4 = 2;
        }
        else {
          setCapabilityPointer
                    (dstSegment,dstCapTable,dst,
                     (Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
          iVar4 = 1;
        }
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
        pwVar11 = (word *)0x1;
        pSVar6 = dstSegment;
LAB_00124a83:
        if (iVar4 != 2) goto LAB_00124610;
        goto LAB_001245f0;
      }
      pDVar18 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
                ((Fault *)pDVar18,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x821,FAILED,"src->isCapability()","_kjCondition,\"Unknown pointer type.\"",
                 (DebugExpression<bool> *)&newSegment,(char (*) [22])"Unknown pointer type.");
    }
LAB_001245e1:
    kj::_::Debug::Fault::~Fault((Fault *)pDVar18);
  }
LAB_001245f0:
  if ((dst->field_1).upper32Bits != 0 || (dst->offsetAndKind).value != 0) {
    zeroObject(dstSegment,dstCapTable,dst);
    dst->offsetAndKind = 0;
    dst->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  pwVar11 = (word *)0x0;
  pSVar6 = dstSegment;
LAB_00124610:
  SVar20.value = pwVar11;
  SVar20.segment = pSVar6;
  return SVar20;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_SOME(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = &p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_SOME(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }